

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dds_gsketch.c
# Opt level: O3

void base_update_impl(dds_gsketch *gsketch,double value,long count)

{
  store_type sVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  dds_bucket_id_mapping *bid_mapping;
  dds_bucket_id_mapping *pdVar6;
  int iVar7;
  dds_mapstore *store;
  dds_store *pdVar8;
  long lVar9;
  double value_00;
  
  value_00 = ABS(value);
  _Var2 = dds_sketch_is_addressable(&gsketch->super,value_00);
  if (_Var2) {
    if (gsketch->min_addressable_absvalue <= value_00) {
      iVar5 = dds_get_bucket_id(gsketch->id_map,value_00);
      if (count < 1) {
        if (count < 0) {
          if (value <= 0.0) {
            pdVar8 = gsketch->nestore;
          }
          else {
            pdVar8 = gsketch->postore;
          }
          dds_store_remove(pdVar8,iVar5,count);
        }
      }
      else {
        if (value <= 0.0) {
          pdVar8 = gsketch->nestore;
        }
        else {
          pdVar8 = gsketch->postore;
        }
        dds_store_insert(pdVar8,iVar5,count);
      }
    }
    else if (count < 1) {
      if ((count < 0) && (lVar9 = count + gsketch->zero_bucket, -1 < lVar9)) {
        gsketch->zero_bucket = lVar9;
      }
    }
    else {
      gsketch->zero_bucket = gsketch->zero_bucket + count;
    }
  }
  iVar3 = dds_store_get_num_buckets(gsketch->postore);
  iVar4 = dds_store_get_num_buckets(gsketch->nestore);
  iVar5 = gsketch->max_sketch_size;
  if (iVar4 + iVar3 <= iVar5) {
    return;
  }
  sVar1 = gsketch->store_type;
  if (sVar1 == COLLAPSINGHIGH_MAPSTORE) {
    store = (dds_mapstore *)gsketch->postore;
    iVar7 = iVar5 - iVar4;
    if (iVar7 != 0 && iVar4 <= iVar5) goto LAB_00103cb9;
    iVar7 = dds_mapstore_resize(store,1);
    store = (dds_mapstore *)gsketch->nestore;
  }
  else {
    if (sVar1 != COLLAPSINGLOW_MAPSTORE) {
      if (sVar1 != COLLAPSINGALL_MAPSTORE) {
        return;
      }
      do {
        iVar5 = dds_store_get_num_buckets(gsketch->nestore);
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        else {
          dds_mapstore_collapse((dds_mapstore *)gsketch->nestore);
          iVar5 = dds_store_get_num_buckets(gsketch->nestore);
        }
        iVar3 = dds_store_get_num_buckets(gsketch->postore);
        if (0 < iVar3) {
          dds_mapstore_collapse((dds_mapstore *)gsketch->postore);
          iVar3 = dds_store_get_num_buckets(gsketch->postore);
          iVar5 = iVar5 + iVar3;
        }
        bid_mapping = dds_sketch_get_id_mapping(&gsketch->super);
        pdVar6 = dds_sketch_get_id_mapping(&gsketch->super);
        dds_bucket_id_mapping_update(bid_mapping,pdVar6->gamma_value * pdVar6->gamma_value);
      } while (gsketch->max_sketch_size < iVar5);
      return;
    }
    store = (dds_mapstore *)gsketch->nestore;
    iVar7 = iVar5 - iVar3;
    if (iVar7 != 0 && iVar3 <= iVar5) goto LAB_00103cb9;
    iVar7 = dds_mapstore_resize(store,1);
    store = (dds_mapstore *)gsketch->postore;
  }
  iVar7 = gsketch->max_sketch_size - iVar7;
LAB_00103cb9:
  dds_mapstore_resize(store,iVar7);
  return;
}

Assistant:

static void base_update_impl(struct dds_gsketch *gsketch, double value, long count){
    double absvalue = fabs(value);
    if (dds_sketch_is_addressable(gsketch, absvalue)) {
        if (absvalue < gsketch->min_addressable_absvalue) {
            if (count > 0) {
                gsketch->zero_bucket += count;
            } else if (count < 0 && (gsketch->zero_bucket + count) >= 0) {
                gsketch->zero_bucket += count;
            }
        } else {
            int bid = dds_get_bucket_id(gsketch->id_map, absvalue);
            if (count > 0) {
                if (value > 0) {
                    dds_store_insert(gsketch->postore, bid, count);
                } else {
                    dds_store_insert(gsketch->nestore, bid, count);
                }
            } else if (count < 0) {
                if (value > 0) {
                    dds_store_remove(gsketch->postore, bid, count);
                } else {
                    dds_store_remove(gsketch->nestore, bid, count);
                }
            }
        }
    }
    int num_pbuckets = get_num_pvalue_buckets(gsketch);
    int num_nbuckets = get_num_nvalue_buckets(gsketch);
    int num_buckets = num_pbuckets + num_nbuckets;
    if (num_buckets > gsketch->max_sketch_size) {
        switch(gsketch->store_type) {
            case COLLAPSINGHIGH_MAPSTORE:
                if (num_nbuckets < gsketch->max_sketch_size) {
                    dds_mapstore_resize((struct dds_mapstore*)gsketch->postore, gsketch->max_sketch_size - num_nbuckets);
                } else {
                    num_pbuckets = dds_mapstore_resize((struct dds_mapstore*)gsketch->postore, 1);
                    dds_mapstore_resize((struct dds_mapstore*)gsketch->nestore, gsketch->max_sketch_size - num_pbuckets);
                }
                break;
            case COLLAPSINGLOW_MAPSTORE:
                if (num_pbuckets < gsketch->max_sketch_size) {
                    dds_mapstore_resize((struct dds_mapstore*)gsketch->nestore, gsketch->max_sketch_size - num_pbuckets);
                } else {
                    num_nbuckets = dds_mapstore_resize((struct dds_mapstore*)gsketch->nestore, 1);
                    dds_mapstore_resize((struct dds_mapstore*)gsketch->postore, gsketch->max_sketch_size - num_nbuckets);
                }
                break;
            case COLLAPSINGALL_MAPSTORE:
                while (num_buckets > gsketch->max_sketch_size) { // we reached the max number of buckets
                    num_buckets = 0;
                    if (dds_store_get_num_buckets(gsketch->nestore) > 0) {
                        dds_mapstore_collapse((struct dds_mapstore *) gsketch->nestore);
                        num_buckets += dds_store_get_num_buckets(gsketch->nestore);
                    }
                    if (dds_store_get_num_buckets(gsketch->postore) > 0) {
                        dds_mapstore_collapse((struct dds_mapstore *) gsketch->postore);
                        num_buckets += dds_store_get_num_buckets(gsketch->postore);
                    }
                    dds_bucket_id_mapping_update(dds_sketch_get_id_mapping((struct dds_sketch*)gsketch), pow(dds_sketch_get_id_mapping((struct dds_sketch*)gsketch)->gamma_value,2.0));
                }
                break;
            default:
                return;
        }
    }
}